

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

MethodOptions * __thiscall google::protobuf::MethodOptions::New(MethodOptions *this,Arena *arena)

{
  MethodOptions *this_00;
  
  this_00 = (MethodOptions *)operator_new(0x70);
  MethodOptions(this_00);
  if (arena != (Arena *)0x0) {
    Arena::Own<google::protobuf::MethodOptions>(arena,this_00);
  }
  return this_00;
}

Assistant:

MethodOptions* MethodOptions::New(::google::protobuf::Arena* arena) const {
  MethodOptions* n = new MethodOptions;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}